

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

char * testing::internal::ParseFlagValue(char *str,char *flag,bool def_optional)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  String flag_str;
  char *local_30;
  size_t local_28;
  
  if (flag == (char *)0x0 || str == (char *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    String::Format((char *)&local_30,"--%s%s","gtest_",flag);
    iVar1 = strncmp(str,local_30,local_28);
    if (iVar1 == 0) {
      pcVar3 = str + local_28;
      if ((!def_optional) || (pcVar2 = pcVar3, *pcVar3 != '\0')) {
        pcVar2 = (char *)0x0;
        if (*pcVar3 == '=') {
          pcVar2 = pcVar3 + 1;
        }
      }
    }
    else {
      pcVar2 = (char *)0x0;
    }
    if (local_30 != (char *)0x0) {
      operator_delete__(local_30);
    }
  }
  return pcVar2;
}

Assistant:

const char* ParseFlagValue(const char* str,
                           const char* flag,
                           bool def_optional) {
  // str and flag must not be NULL.
  if (str == NULL || flag == NULL) return NULL;

  // The flag must start with "--" followed by GTEST_FLAG_PREFIX_.
  const String flag_str = String::Format("--%s%s", GTEST_FLAG_PREFIX_, flag);
  const size_t flag_len = flag_str.length();
  if (strncmp(str, flag_str.c_str(), flag_len) != 0) return NULL;

  // Skips the flag name.
  const char* flag_end = str + flag_len;

  // When def_optional is true, it's OK to not have a "=value" part.
  if (def_optional && (flag_end[0] == '\0')) {
    return flag_end;
  }

  // If def_optional is true and there are more characters after the
  // flag name, or if def_optional is false, there must be a '=' after
  // the flag name.
  if (flag_end[0] != '=') return NULL;

  // Returns the string after "=".
  return flag_end + 1;
}